

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::ReportError_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,Nonnull<CordRep_*> root,
          Nonnull<CordRep_*> node)

{
  byte bVar1;
  crc32c_t crc;
  ostream *poVar2;
  CordRepCrc *pCVar3;
  CordRepSubstring *pCVar4;
  CordRep **ppCVar5;
  CordRepExternal *pCVar6;
  CordRepFlat *pCVar7;
  ulong uVar8;
  char *pcVar9;
  ostream *in_R9;
  string_view src;
  string_view src_00;
  string_view label;
  string local_1c8;
  ostringstream buf;
  undefined8 auStack_198 [45];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar2 = std::operator<<((ostream *)&buf,"Error at node ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::operator<<(poVar2," in:");
  uVar8 = 0;
  do {
    *(undefined8 *)((long)auStack_198 + *(long *)(_buf + -0x18)) = 3;
    std::ostream::_M_insert<unsigned_long>((ulong)&buf);
    poVar2 = std::operator<<((ostream *)&buf," ");
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 7;
    if ((CordRepBtree *)this == (CordRepBtree *)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<((ostream *)&buf," [");
      std::ostream::_M_insert<void_const*>(&buf);
      std::operator<<((ostream *)&buf,"]");
      poVar2 = std::operator<<((ostream *)&buf," ");
      *(ulong *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = uVar8 & 0xffffffff;
      std::operator<<(poVar2,"");
      pcVar9 = "NULL\n";
LAB_00259cd5:
      std::operator<<((ostream *)&buf,pcVar9);
LAB_00259cdf:
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      return __return_storage_ptr__;
    }
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)&buf," [");
    std::ostream::_M_insert<void_const*>((ostream *)&buf);
    std::operator<<((ostream *)&buf,"]");
    poVar2 = std::operator<<((ostream *)&buf," ");
    pcVar9 = *(char **)(*(long *)poVar2 + -0x18);
    *(ulong *)(poVar2 + 0x10 + (long)pcVar9) = uVar8;
    std::operator<<(poVar2,"");
    bVar1 = (((CordRepBtree *)this)->super_CordRep).tag;
    if (bVar1 == 1) {
      poVar2 = std::operator<<((ostream *)&buf,"SUBSTRING @ ");
      cord_internal::CordRep::substring((CordRep *)this);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"\n");
      pCVar4 = cord_internal::CordRep::substring((CordRep *)this);
      ppCVar5 = &pCVar4->child;
    }
    else {
      if (bVar1 != 2) {
        if (bVar1 == 5) {
          std::operator<<((ostream *)&buf,"EXTERNAL [");
          pCVar6 = cord_internal::CordRep::external((CordRep *)this);
          src._M_str = pcVar9;
          src._M_len = (size_t)pCVar6->base;
          CEscape_abi_cxx11_(&local_1c8,
                             (lts_20250127 *)(((CordRepBtree *)this)->super_CordRep).length,src);
          std::operator<<((ostream *)&buf,(string *)&local_1c8);
        }
        else {
          if (bVar1 < 6) {
            label._M_str = (char *)0x1;
            label._M_len = (size_t)"";
            cord_internal::CordRepBtree::Dump
                      ((CordRepBtree *)this,(CordRep *)0x0,label,SUB81(&buf,0),in_R9);
            goto LAB_00259cdf;
          }
          poVar2 = std::operator<<((ostream *)&buf,"FLAT cap=");
          pCVar7 = cord_internal::CordRep::flat((CordRep *)this);
          cord_internal::CordRepFlat::Capacity(pCVar7);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::operator<<(poVar2," [");
          pCVar7 = cord_internal::CordRep::flat((CordRep *)this);
          src_00._M_str = pcVar9;
          src_00._M_len = (size_t)(pCVar7->super_CordRep).storage;
          CEscape_abi_cxx11_(&local_1c8,
                             (lts_20250127 *)(((CordRepBtree *)this)->super_CordRep).length,src_00);
          std::operator<<((ostream *)&buf,(string *)&local_1c8);
        }
        std::__cxx11::string::~string((string *)&local_1c8);
        pcVar9 = "]\n";
        goto LAB_00259cd5;
      }
      poVar2 = std::operator<<((ostream *)&buf,"CRC crc=");
      pCVar3 = cord_internal::CordRep::crc((CordRep *)this);
      crc = crc_internal::CrcCordState::Checksum(&pCVar3->crc_cord_state);
      poVar2 = operator<<(poVar2,crc);
      std::operator<<(poVar2,"\n");
      pCVar3 = cord_internal::CordRep::crc((CordRep *)this);
      ppCVar5 = &pCVar3->child;
    }
    uVar8 = uVar8 + 1;
    this = (lts_20250127 *)*ppCVar5;
  } while( true );
}

Assistant:

static std::string ReportError(absl::Nonnull<CordRep*> root,
                               absl::Nonnull<CordRep*> node) {
  std::ostringstream buf;
  buf << "Error at node " << node << " in:";
  DumpNode(root, true, &buf);
  return buf.str();
}